

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
 __thiscall
Indexing::
SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::next(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
       *this)

{
  __uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_> this_00;
  char cVar1;
  bool bVar2;
  Rhs *this_01;
  TypedTermList TVar3;
  QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
  QVar4;
  Renaming normalizer;
  Renaming local_48;
  
  do {
    if ((this->_leafData).
        super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
        ._isSome == true) {
      cVar1 = (**(code **)(*(long *)(this->_leafData).
                                    super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
                                    ._elem._elem + 0x10))();
      if (cVar1 != '\0') break;
    }
    bVar2 = findNextLeaf(this);
  } while (bVar2);
  this_01 = (Rhs *)(**(code **)(*(long *)(this->_leafData).
                                         super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
                                         ._elem._elem + 0x18))();
  if (this->_retrieveSubstitution == true) {
    local_48._data._timestamp = 1;
    local_48._data._size = 0;
    local_48._data._deleted = 0;
    local_48._data._capacityIndex = 0;
    local_48._data._capacity = 0;
    local_48._data._20_8_ = 0;
    local_48._data._28_8_ = 0;
    local_48._36_8_ = 0;
    local_48._identity = true;
    TVar3 = Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs::
            key(this_01);
    Kernel::Renaming::normalizeVariables(&local_48,TVar3.super_TermList._content);
    Kernel::Renaming::normalizeVariables(&local_48,(uint64_t)TVar3._sort._content);
    this_00._M_t.
    super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
    .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl =
         (this->_algo)._unif._subs._self._M_t.
         super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
         ._M_t;
    if (*(BacktrackData ***)
         ((long)this_00._M_t.
                super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl + 0x10) ==
        *(BacktrackData ***)
         ((long)this_00._M_t.
                super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl + 0x18)) {
      ::Lib::Stack<Lib::BacktrackData_*>::expand
                ((Stack<Lib::BacktrackData_*> *)
                 this_00._M_t.
                 super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                 .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl);
    }
    **(BacktrackData ***)
      ((long)this_00._M_t.
             super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
             .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl + 0x10) =
         &this->_normalizationBacktrackData;
    *(BacktrackData ***)
     ((long)this_00._M_t.
            super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
            .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl + 0x10) =
         *(BacktrackData ***)
          ((long)this_00._M_t.
                 super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                 .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl + 0x10) + 1;
    this->_normalizationRecording = true;
    Kernel::RobSubstitution::denormalize
              ((RobSubstitution *)
               (this->_algo)._unif._subs._self._M_t.
               super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
               ._M_t,&local_48,2,1);
    ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
              (&local_48._data);
  }
  QVar4.data = this_01;
  QVar4.unifier = (AbstractingUnifier *)this;
  return QVar4;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }